

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flFTP.cpp
# Opt level: O3

int __thiscall
Rainbow::CommPort::CheckRespondCode
          (CommPort *this,string *respondMessage,string *futureCode,string *errorDesc)

{
  _Alloc_hider __nptr;
  int iVar1;
  const_iterator cVar2;
  int *piVar3;
  long lVar4;
  undefined8 uVar5;
  int iVar6;
  string respondCode;
  key_type local_58;
  char *local_38;
  
  std::__cxx11::string::substr((ulong)&local_58,(ulong)respondMessage);
  if ((local_58._M_string_length != futureCode->_M_string_length) ||
     ((iVar6 = 0, local_58._M_string_length != 0 &&
      (iVar1 = bcmp(local_58._M_dataplus._M_p,(futureCode->_M_dataplus)._M_p,
                    local_58._M_string_length), iVar1 != 0)))) {
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)_errDescTable_abi_cxx11_,&local_58);
    if (cVar2._M_node != (_Base_ptr)(_errDescTable_abi_cxx11_ + 8)) {
      std::__cxx11::string::_M_assign((string *)this);
      std::__cxx11::string::_M_assign((string *)errorDesc);
      __nptr._M_p = local_58._M_dataplus._M_p;
      piVar3 = __errno_location();
      iVar6 = *piVar3;
      *piVar3 = 0;
      lVar4 = strtol(__nptr._M_p,&local_38,10);
      if (local_38 == __nptr._M_p) {
        std::__throw_invalid_argument("stoi");
      }
      else {
        iVar1 = (int)lVar4;
        if ((iVar1 == lVar4) && (*piVar3 != 0x22)) {
          if (*piVar3 == 0) {
            *piVar3 = iVar6;
          }
          iVar6 = -iVar1;
          if (iVar1 < 1) {
            iVar6 = iVar1;
          }
          goto LAB_00112f05;
        }
      }
      uVar5 = std::__throw_out_of_range("stoi");
      if (*piVar3 == 0) {
        *piVar3 = iVar6;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar5);
    }
    std::__cxx11::string::_M_replace
              ((ulong)errorDesc,0,(char *)errorDesc->_M_string_length,0x11c582);
    iVar6 = -1;
  }
LAB_00112f05:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return iVar6;
}

Assistant:

int CommPort::CheckRespondCode(const std::string &respondMessage, 
					const std::string &futureCode,
					std::string &errorDesc)
	{
		std::string respondCode = respondMessage.substr(0, 3);
		
		if(respondCode == futureCode)
		{
			//errorDesc = "";
			return 0;
		}

		auto search = _errDescTable.find(respondCode);
		if(search != _errDescTable.end())
		{
			_errorMessage = search->second;
			errorDesc = search->second;
			return -(std::abs(std::stoi(respondCode)));
		}

		errorDesc = "Unknow error";
		return -1;
	}